

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eliminate_dead_io_components_pass.cpp
# Opt level: O2

uint __thiscall
spvtools::opt::EliminateDeadIOComponentsPass::FindMaxIndex
          (EliminateDeadIOComponentsPass *this,Instruction *var,uint original_max,
          bool skip_first_index)

{
  uint32_t id;
  DefUseManager *this_00;
  _func_void *p_Var1;
  bool seen_non_const_ac;
  uint max;
  uint local_e4;
  _Any_data local_e0;
  code *local_d0;
  code *local_c8;
  uint *local_c0;
  bool *pbStack_b8;
  Instruction local_b0;
  undefined1 local_40;
  undefined7 uStack_3f;
  EliminateDeadIOComponentsPass *pEStack_38;
  
  max = 0;
  seen_non_const_ac = false;
  local_e4 = original_max;
  if (var->opcode_ == OpVariable) {
    this_00 = IRContext::get_def_use_mgr((this->super_Pass).context_);
    id = Instruction::result_id(var);
    local_c0 = &max;
    pbStack_b8 = &seen_non_const_ac;
    Instruction::Instruction(&local_b0,var);
    local_e0._8_8_ = 0;
    local_40 = skip_first_index;
    pEStack_38 = this;
    p_Var1 = (_func_void *)::operator_new(0x90);
    *(uint **)p_Var1 = local_c0;
    *(bool **)(p_Var1 + 8) = pbStack_b8;
    Instruction::Instruction((Instruction *)(p_Var1 + 0x10),&local_b0);
    *(long *)(p_Var1 + 0x80) = CONCAT71(uStack_3f,local_40);
    *(EliminateDeadIOComponentsPass **)(p_Var1 + 0x88) = pEStack_38;
    local_c8 = std::
               _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/eliminate_dead_io_components_pass.cpp:151:24)>
               ::_M_invoke;
    local_d0 = std::
               _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/eliminate_dead_io_components_pass.cpp:151:24)>
               ::_M_manager;
    local_e0._M_unused._0_8_ = (undefined8)p_Var1;
    analysis::DefUseManager::WhileEachUser
              (this_00,id,(function<bool_(spvtools::opt::Instruction_*)> *)&local_e0);
    if (local_d0 != (code *)0x0) {
      (*local_d0)(&local_e0,&local_e0,__destroy_functor);
    }
    Instruction::~Instruction(&local_b0);
    if (seen_non_const_ac == false) {
      local_e4 = max;
    }
    return local_e4;
  }
  __assert_fail("var.opcode() == spv::Op::OpVariable && \"must be variable\"",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/eliminate_dead_io_components_pass.cpp"
                ,0x95,
                "unsigned int spvtools::opt::EliminateDeadIOComponentsPass::FindMaxIndex(const Instruction &, const unsigned int, const bool)"
               );
}

Assistant:

unsigned EliminateDeadIOComponentsPass::FindMaxIndex(
    const Instruction& var, const unsigned original_max,
    const bool skip_first_index) {
  unsigned max = 0;
  bool seen_non_const_ac = false;
  assert(var.opcode() == spv::Op::OpVariable && "must be variable");
  context()->get_def_use_mgr()->WhileEachUser(
      var.result_id(), [&max, &seen_non_const_ac, var, skip_first_index,
                        this](Instruction* use) {
        auto use_opcode = use->opcode();
        if (use_opcode == spv::Op::OpLoad || use_opcode == spv::Op::OpStore ||
            use_opcode == spv::Op::OpCopyMemory ||
            use_opcode == spv::Op::OpCopyMemorySized ||
            use_opcode == spv::Op::OpCopyObject) {
          seen_non_const_ac = true;
          return false;
        }
        if (use->opcode() != spv::Op::OpAccessChain &&
            use->opcode() != spv::Op::OpInBoundsAccessChain) {
          return true;
        }
        // OpAccessChain with no indices currently not optimized
        if (use->NumInOperands() == 1 ||
            (skip_first_index && use->NumInOperands() == 2)) {
          seen_non_const_ac = true;
          return false;
        }
        const unsigned base_id =
            use->GetSingleWordInOperand(kAccessChainBaseInIdx);
        USE_ASSERT(base_id == var.result_id() && "unexpected base");
        const unsigned in_idx = skip_first_index ? kAccessChainIndex1InIdx
                                                 : kAccessChainIndex0InIdx;
        const unsigned idx_id = use->GetSingleWordInOperand(in_idx);
        Instruction* idx_inst = context()->get_def_use_mgr()->GetDef(idx_id);
        if (idx_inst->opcode() != spv::Op::OpConstant) {
          seen_non_const_ac = true;
          return false;
        }
        unsigned value = idx_inst->GetSingleWordInOperand(kConstantValueInIdx);
        if (value > max) max = value;
        return true;
      });
  return seen_non_const_ac ? original_max : max;
}